

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O3

string * convert_pub_filename(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  do {
    if (cVar1 == '\0') {
      return __return_storage_ptr__;
    }
    if ((cVar1 == '0') &&
       ((ulong)((long)pcVar2 - (long)(s->_M_dataplus)._M_p) < s->_M_string_length - 3)) {
      if ((pcVar2[1] != '0') || (pcVar2[2] != '1')) goto LAB_00134bc5;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar2 = pcVar2 + 2;
    }
    else {
      if (cVar1 == '%') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
LAB_00134bc5:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    cVar1 = pcVar2[1];
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

std::string convert_pub_filename(const std::string& s)
{
	std::string result;

	for (const char* p = &s[0]; *p != '\0'; ++p)
	{
		if ((p - &s[0]) < s.size() - 3 && p[0] == '0' && p[1] == '0' && p[2] == '1')
		{
			result += "%03d";
			p += 2;
			continue;
		}

		if (*p == '%')
			result += '%';

		result += *p;
	}

	return result;
}